

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

xmlParserErrors xmlLookupCharEncodingHandler(xmlCharEncoding enc,xmlCharEncodingHandler **out)

{
  xmlCharEncodingHandler *pxVar1;
  xmlCharEncFlags flags;
  xmlCharEncodingHandler *handler;
  xmlCharEncodingHandler **out_local;
  xmlCharEncoding enc_local;
  
  if (out == (xmlCharEncodingHandler **)0x0) {
    out_local._4_4_ = XML_ERR_ARGUMENT;
  }
  else {
    *out = (xmlCharEncodingHandler *)0x0;
    if ((enc < XML_CHAR_ENCODING_UTF8) || (0x1e < (uint)enc)) {
      out_local._4_4_ = XML_ERR_UNSUPPORTED_ENCODING;
    }
    else if ((enc == XML_CHAR_ENCODING_UTF8) || (enc == XML_CHAR_ENCODING_NONE)) {
      out_local._4_4_ = XML_ERR_OK;
    }
    else {
      pxVar1 = defaultHandlers + enc;
      if ((defaultHandlers[enc].input.func == (xmlCharEncConvFunc)0x0) &&
         (defaultHandlers[enc].output.func == (xmlCharEncConvFunc)0x0)) {
        if (pxVar1->name == (char *)0x0) {
          out_local._4_4_ = XML_ERR_UNSUPPORTED_ENCODING;
        }
        else {
          out_local._4_4_ =
               xmlFindExtraHandler(pxVar1->name,pxVar1->name,XML_ENC_OUTPUT|XML_ENC_INPUT,
                                   (xmlCharEncConvImpl)0x0,(void *)0x0,out);
        }
      }
      else {
        *out = pxVar1;
        out_local._4_4_ = XML_ERR_OK;
      }
    }
  }
  return out_local._4_4_;
}

Assistant:

xmlParserErrors
xmlLookupCharEncodingHandler(xmlCharEncoding enc,
                             xmlCharEncodingHandler **out) {
    const xmlCharEncodingHandler *handler;

    if (out == NULL)
        return(XML_ERR_ARGUMENT);
    *out = NULL;

    if ((enc <= 0) || ((size_t) enc >= NUM_DEFAULT_HANDLERS))
        return(XML_ERR_UNSUPPORTED_ENCODING);

    /* Return NULL handler for UTF-8 */
    if ((enc == XML_CHAR_ENCODING_UTF8) ||
        (enc == XML_CHAR_ENCODING_NONE))
        return(XML_ERR_OK);

    handler = &defaultHandlers[enc];
    if ((handler->input.func != NULL) || (handler->output.func != NULL)) {
        *out = (xmlCharEncodingHandler *) handler;
        return(XML_ERR_OK);
    }

    if (handler->name != NULL) {
        xmlCharEncFlags flags = XML_ENC_INPUT;

#ifdef LIBXML_OUTPUT_ENABLED
        flags |= XML_ENC_OUTPUT;
#endif
        return(xmlFindExtraHandler(handler->name, handler->name, flags,
                                   NULL, NULL, out));
    }

    return(XML_ERR_UNSUPPORTED_ENCODING);
}